

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O1

wchar_t * ON_Font::DefaultPostScriptName(void)

{
  return L"ArialMT";
}

Assistant:

const wchar_t* ON_Font::DefaultPostScriptName()
{
  const wchar_t* s;
#if defined(ON_RUNTIME_WIN)
  s = L"ArialMT";
#elif defined(ON_RUNTIME_APPLE)
  s = L"HelveticaNeue";
#else
  s = L"ArialMT";
#endif
  return s;
}